

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crl.cc
# Opt level: O2

bool __thiscall bssl::ParseCrlTbsCertList(bssl *this,Input tbs_tlv,ParsedCrlTbsCertList *out)

{
  bool bVar1;
  int *piVar2;
  Input input;
  CBS_ASN1_TAG maybe_revoked_certifigates_tag;
  CBS_ASN1_TAG maybe_next_update_tag;
  Parser tbs_parser;
  Input unused_revoked_certificates;
  Input unused_next_update_input;
  optional<bssl::der::Input> version_der;
  Input revoked_certificates_tlv;
  Parser parser;
  
  piVar2 = (int *)tbs_tlv.data_.size_;
  input.data_.size_ = (size_t)tbs_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&parser,input);
  der::Parser::Parser(&tbs_parser);
  bVar1 = der::Parser::ReadSequence(&parser,&tbs_parser);
  if (bVar1) {
    version_der.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
    super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
    bVar1 = der::Parser::ReadOptionalTag(&tbs_parser,2,&version_der);
    if (bVar1) {
      if (version_der.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
          super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
        bVar1 = der::ParseUint64(version_der.super__Optional_base<bssl::der::Input,_true,_true>.
                                 _M_payload.super__Optional_payload_base<bssl::der::Input>.
                                 _M_payload._M_value.data_,(uint64_t *)&unused_next_update_input);
        if (!bVar1) {
          return false;
        }
        if (unused_next_update_input.data_.data_ != (uchar *)0x1) {
          return false;
        }
        *piVar2 = 1;
      }
      else {
        *piVar2 = 0;
      }
      bVar1 = der::Parser::ReadRawTLV(&tbs_parser,(Input *)(piVar2 + 2));
      if (((bVar1) && (bVar1 = der::Parser::ReadRawTLV(&tbs_parser,(Input *)(piVar2 + 6)), bVar1))
         && (bVar1 = ReadUTCOrGeneralizedTime(&tbs_parser,(GeneralizedTime *)(piVar2 + 10)), bVar1))
      {
        unused_next_update_input.data_.data_ = (uchar *)0x0;
        unused_next_update_input.data_.size_ = 0;
        bVar1 = der::Parser::PeekTagAndValue
                          (&tbs_parser,&maybe_next_update_tag,&unused_next_update_input);
        if ((bVar1) && (maybe_next_update_tag - 0x17 < 2)) {
          bVar1 = ReadUTCOrGeneralizedTime
                            (&tbs_parser,(GeneralizedTime *)&unused_revoked_certificates);
          if (!bVar1) {
            return false;
          }
          if ((char)piVar2[0xe] == '\0') {
            *(undefined1 *)(piVar2 + 0xe) = 1;
          }
          *(uchar **)(piVar2 + 0xc) = unused_revoked_certificates.data_.data_;
        }
        else if ((char)piVar2[0xe] == '\x01') {
          *(undefined1 *)(piVar2 + 0xe) = 0;
        }
        unused_revoked_certificates.data_.data_ = (uchar *)0x0;
        unused_revoked_certificates.data_.size_ = 0;
        bVar1 = der::Parser::PeekTagAndValue
                          (&tbs_parser,&maybe_revoked_certifigates_tag,&unused_revoked_certificates)
        ;
        if ((bVar1) && (maybe_revoked_certifigates_tag == 0x20000010)) {
          revoked_certificates_tlv.data_.data_ = (uchar *)0x0;
          revoked_certificates_tlv.data_.size_ = 0;
          bVar1 = der::Parser::ReadRawTLV(&tbs_parser,&revoked_certificates_tlv);
          if (!bVar1) {
            return false;
          }
          *(uchar **)(piVar2 + 0x10) = revoked_certificates_tlv.data_.data_;
          *(size_t *)(piVar2 + 0x12) = revoked_certificates_tlv.data_.size_;
          if ((char)piVar2[0x14] == '\0') {
            *(undefined1 *)(piVar2 + 0x14) = 1;
          }
        }
        else if ((char)piVar2[0x14] == '\x01') {
          *(undefined1 *)(piVar2 + 0x14) = 0;
        }
        bVar1 = der::Parser::ReadOptionalTag
                          (&tbs_parser,0xa0000000,(optional<bssl::der::Input> *)(piVar2 + 0x16));
        if ((bVar1) &&
           ((((char)piVar2[0x1a] != '\x01' || (*piVar2 == 1)) &&
            (bVar1 = der::Parser::HasMore(&tbs_parser), !bVar1)))) {
          bVar1 = der::Parser::HasMore(&parser);
          return !bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ParseCrlTbsCertList(der::Input tbs_tlv, ParsedCrlTbsCertList *out) {
  der::Parser parser(tbs_tlv);

  //   TBSCertList  ::=  SEQUENCE  {
  der::Parser tbs_parser;
  if (!parser.ReadSequence(&tbs_parser)) {
    return false;
  }

  //         version                 Version OPTIONAL,
  //                                      -- if present, MUST be v2
  std::optional<der::Input> version_der;
  if (!tbs_parser.ReadOptionalTag(CBS_ASN1_INTEGER, &version_der)) {
    return false;
  }
  if (version_der.has_value()) {
    uint64_t version64;
    if (!der::ParseUint64(*version_der, &version64)) {
      return false;
    }
    // If version is present, it MUST be v2(1).
    if (version64 != 1) {
      return false;
    }
    out->version = CrlVersion::V2;
  } else {
    // Uh, RFC 5280 doesn't actually say it anywhere, but presumably if version
    // is not specified, it is V1.
    out->version = CrlVersion::V1;
  }

  //         signature               AlgorithmIdentifier,
  if (!tbs_parser.ReadRawTLV(&out->signature_algorithm_tlv)) {
    return false;
  }

  //         issuer                  Name,
  if (!tbs_parser.ReadRawTLV(&out->issuer_tlv)) {
    return false;
  }

  //         thisUpdate              Time,
  if (!ReadUTCOrGeneralizedTime(&tbs_parser, &out->this_update)) {
    return false;
  }

  //         nextUpdate              Time OPTIONAL,
  CBS_ASN1_TAG maybe_next_update_tag;
  der::Input unused_next_update_input;
  if (tbs_parser.PeekTagAndValue(&maybe_next_update_tag,
                                 &unused_next_update_input) &&
      (maybe_next_update_tag == CBS_ASN1_UTCTIME ||
       maybe_next_update_tag == CBS_ASN1_GENERALIZEDTIME)) {
    der::GeneralizedTime next_update_time;
    if (!ReadUTCOrGeneralizedTime(&tbs_parser, &next_update_time)) {
      return false;
    }
    out->next_update = next_update_time;
  } else {
    out->next_update = std::nullopt;
  }

  //         revokedCertificates     SEQUENCE OF SEQUENCE  { ... } OPTIONAL,
  der::Input unused_revoked_certificates;
  CBS_ASN1_TAG maybe_revoked_certifigates_tag;
  if (tbs_parser.PeekTagAndValue(&maybe_revoked_certifigates_tag,
                                 &unused_revoked_certificates) &&
      maybe_revoked_certifigates_tag == CBS_ASN1_SEQUENCE) {
    der::Input revoked_certificates_tlv;
    if (!tbs_parser.ReadRawTLV(&revoked_certificates_tlv)) {
      return false;
    }
    out->revoked_certificates_tlv = revoked_certificates_tlv;
  } else {
    out->revoked_certificates_tlv = std::nullopt;
  }

  //         crlExtensions           [0]  EXPLICIT Extensions OPTIONAL
  //                                       -- if present, version MUST be v2
  if (!tbs_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0,
          &out->crl_extensions_tlv)) {
    return false;
  }
  if (out->crl_extensions_tlv.has_value()) {
    if (out->version != CrlVersion::V2) {
      return false;
    }
  }

  if (tbs_parser.HasMore()) {
    // Invalid or extraneous elements.
    return false;
  }

  // By definition the input was a single sequence, so there shouldn't be
  // unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}